

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasterrcnn.cpp
# Opt level: O0

void nms_sorted_bboxes(vector<Object,_std::allocator<Object>_> *faceobjects,
                      vector<int,_std::allocator<int>_> *picked,float nms_threshold,bool agnostic)

{
  float fVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  byte in_DL;
  vector<int,_std::allocator<int>_> *in_RSI;
  Object *in_RDI;
  float in_XMM0_Da;
  float fVar8;
  float union_area;
  float inter_area;
  Object *b;
  int j;
  int keep;
  Object *a;
  int i_1;
  int i;
  vector<float,_std::allocator<float>_> areas;
  int n;
  Object *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  vector<float,_std::allocator<float>_> *this;
  int local_68;
  int local_54;
  int local_50;
  undefined1 local_39 [29];
  int local_1c;
  byte local_15;
  float local_14;
  vector<int,_std::allocator<int>_> *local_10;
  Object *local_8;
  
  local_15 = in_DL & 1;
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x127798);
  sVar3 = std::vector<Object,_std::allocator<Object>_>::size
                    ((vector<Object,_std::allocator<Object>_> *)local_8);
  local_1c = (int)sVar3;
  sVar3 = (size_type)local_1c;
  this = (vector<float,_std::allocator<float>_> *)local_39;
  std::allocator<float>::allocator((allocator<float> *)0x1277c8);
  std::vector<float,_std::allocator<float>_>::vector
            (this,sVar3,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  std::allocator<float>::~allocator((allocator<float> *)0x1277e8);
  for (local_50 = 0; local_50 < local_1c; local_50 = local_50 + 1) {
    pvVar4 = std::vector<Object,_std::allocator<Object>_>::operator[]
                       ((vector<Object,_std::allocator<Object>_> *)local_8,(long)local_50);
    in_stack_ffffffffffffff74 = cv::Rect_<float>::area(&pvVar4->rect);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_39 + 1),(long)local_50);
    *pvVar5 = in_stack_ffffffffffffff74;
  }
  for (local_54 = 0; local_54 < local_1c; local_54 = local_54 + 1) {
    pvVar4 = std::vector<Object,_std::allocator<Object>_>::operator[]
                       ((vector<Object,_std::allocator<Object>_> *)local_8,(long)local_54);
    bVar2 = true;
    local_68 = 0;
    while (in_stack_ffffffffffffff70 = local_68,
          sVar3 = std::vector<int,_std::allocator<int>_>::size(local_10),
          in_stack_ffffffffffffff70 < (int)sVar3) {
      in_stack_ffffffffffffff68 = local_8;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_68);
      pvVar7 = std::vector<Object,_std::allocator<Object>_>::operator[]
                         ((vector<Object,_std::allocator<Object>_> *)in_stack_ffffffffffffff68,
                          (long)*pvVar6);
      if (((local_15 & 1) != 0) || (pvVar4->label == pvVar7->label)) {
        fVar8 = intersection_area((Object *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff68);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_39 + 1),(long)local_54);
        fVar1 = *pvVar5;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_68);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_39 + 1),(long)*pvVar6);
        if (local_14 < fVar8 / ((fVar1 + *pvVar5) - fVar8)) {
          bVar2 = false;
        }
      }
      local_68 = local_68 + 1;
    }
    if (bVar2) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (value_type_conflict *)in_stack_ffffffffffffff68);
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  return;
}

Assistant:

static void nms_sorted_bboxes(const std::vector<Object>& faceobjects, std::vector<int>& picked, float nms_threshold, bool agnostic = false)
{
    picked.clear();

    const int n = faceobjects.size();

    std::vector<float> areas(n);
    for (int i = 0; i < n; i++)
    {
        areas[i] = faceobjects[i].rect.area();
    }

    for (int i = 0; i < n; i++)
    {
        const Object& a = faceobjects[i];

        int keep = 1;
        for (int j = 0; j < (int)picked.size(); j++)
        {
            const Object& b = faceobjects[picked[j]];

            if (!agnostic && a.label != b.label)
                continue;

            // intersection over union
            float inter_area = intersection_area(a, b);
            float union_area = areas[i] + areas[picked[j]] - inter_area;
            // float IoU = inter_area / union_area
            if (inter_area / union_area > nms_threshold)
                keep = 0;
        }

        if (keep)
            picked.push_back(i);
    }
}